

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::EnumValueDescriptorProto::SharedCtor(EnumValueDescriptorProto *this)

{
  string *default_value;
  EnumValueDescriptorProto *this_local;
  
  this->_cached_size_ = 0;
  default_value = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  internal::ArenaStringPtr::UnsafeSetDefault(&this->name_,default_value);
  memset(&this->options_,0,0xc);
  return;
}

Assistant:

void EnumValueDescriptorProto::SharedCtor() {
  _cached_size_ = 0;
  name_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  ::memset(&options_, 0, reinterpret_cast<char*>(&number_) -
    reinterpret_cast<char*>(&options_) + sizeof(number_));
}